

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp-getelement.cpp
# Opt level: O2

IdentIndex ICM::insertGlobalDyVarbIdentIndex(string *name)

{
  IdentBasicIndex IVar1;
  size_t local_8;
  
  local_8 = Common::
            SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[]((SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)Compiler::GlobalIdentNameMap_abi_cxx11_,name);
  IVar1 = insertFromIdentTable(0,&local_8,I_DyVarb);
  return (IdentIndex)((ulong)IVar1 << 0x20);
}

Assistant:

IdentIndex insertGlobalDyVarbIdentIndex(const string & name) {
		return { 0, insertFromIdentTable(0, Compiler::GlobalIdentNameMap[name], I_DyVarb) };
	}